

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O3

void str_hex(char *dst,int dst_size,void *data,int data_size)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  char *pcVar4;
  
  iVar1 = dst_size + 3;
  if (-1 < dst_size) {
    iVar1 = dst_size;
  }
  uVar2 = (iVar1 >> 2) - 4;
  if (data_size < (int)uVar2) {
    uVar2 = data_size;
  }
  if (0 < (int)uVar2) {
    pcVar4 = dst + 3;
    uVar3 = 0;
    do {
      pcVar4[-3] = "0123456789ABCDEF"[*(byte *)((long)data + uVar3) >> 4];
      pcVar4[-2] = "0123456789ABCDEF"[*(byte *)((long)data + uVar3) & 0xf];
      pcVar4[-1] = ' ';
      pcVar4[0] = '\0';
      uVar3 = uVar3 + 1;
      pcVar4 = pcVar4 + 3;
    } while (uVar2 != uVar3);
  }
  return;
}

Assistant:

void str_hex(char *dst, int dst_size, const void *data, int data_size)
{
	static const char hex[] = "0123456789ABCDEF";
	int b;

	for(b = 0; b < data_size && b < dst_size/4-4; b++)
	{
		dst[b*3] = hex[((const unsigned char *)data)[b]>>4];
		dst[b*3+1] = hex[((const unsigned char *)data)[b]&0xf];
		dst[b*3+2] = ' ';
		dst[b*3+3] = 0;
	}
}